

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QGraphicsObject *item)

{
  bool bVar1;
  byte bVar2;
  QDebug *pQVar3;
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff58;
  char in_stack_ffffffffffffff5f;
  QDebug *in_stack_ffffffffffffff60;
  QString *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  Stream *debug_00;
  QDebug local_48 [7];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  debug_00 = in_RDI;
  pQVar3 = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  if (in_RDX == (QDebug *)0x0) {
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                       (char *)pQVar3);
    QDebug::QDebug(in_stack_ffffffffffffff60,
                   (QDebug *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  else {
    (**(code **)in_RDX->stream)();
    QMetaObject::className();
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                       (char *)pQVar3);
    QDebug::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
    QDebug::operator<<(in_stack_ffffffffffffff60,
                       (void *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    QObject::objectName();
    bVar1 = QString::isEmpty((QString *)0x990980);
    bVar2 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x990993);
    if ((bVar2 & 1) != 0) {
      pQVar3 = QDebug::operator<<((QDebug *)CONCAT17(bVar2,in_stack_ffffffffffffff78),(char *)pQVar3
                                 );
      QObject::objectName();
      QDebug::operator<<(pQVar3,in_stack_ffffffffffffff68);
      QString::~QString((QString *)0x9909db);
    }
    QDebug::QDebug(local_48,in_RSI);
    formatGraphicsItemHelper
              ((QDebug *)debug_00,(QGraphicsItem *)CONCAT17(bVar2,in_stack_ffffffffffffff78));
    QDebug::~QDebug(local_48);
    QDebug::operator<<(in_RDX,in_stack_ffffffffffffff5f);
    QDebug::QDebug(in_RDX,(QDebug *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsObject *item)
{
    QDebugStateSaver saver(debug);
    debug.nospace();

    if (!item) {
        debug << "QGraphicsObject(0)";
        return debug;
    }

    debug << item->metaObject()->className() << '(' << static_cast<const void *>(item);
    if (!item->objectName().isEmpty())
        debug << ", name=" << item->objectName();
    formatGraphicsItemHelper(debug, item);
    debug << ')';
    return debug;
}